

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  value_type_conflict vVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  byte *pbVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 uVar8;
  size_type sVar9;
  element_type *peVar10;
  pointer pvVar11;
  value_type_conflict *pvVar12;
  reference pvVar13;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  string sn_1;
  string sn;
  uint8_t byte;
  size_t i;
  size_t undumped_chars;
  size_t bytes_after_last_accept;
  size_t bytes;
  uint8_t state;
  uint32_t codepoint;
  uint32_t *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  value_type_conflict in_stack_fffffffffffffe4f;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  ulong uVar14;
  int iVar15;
  allocator local_129;
  string local_128 [39];
  undefined1 local_101;
  allocator local_69;
  string local_68 [39];
  byte local_41;
  ulong local_40;
  long local_38;
  long local_30;
  long local_28;
  char local_19;
  uint local_18;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  local_19 = '\0';
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_10 = in_RSI;
  do {
    uVar14 = local_40;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar14) {
      if (local_19 == '\0') {
        if (local_28 != 0) {
          peVar10 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1282e5);
          pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x1282fb);
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar11,local_28);
        }
      }
      else {
        iVar15 = *(int *)(in_RDI + 0x280);
        if (iVar15 == 0) {
          std::allocator<char>::allocator();
          iVar15 = (int)(uVar14 >> 0x20);
          std::__cxx11::string::string(local_128,3,'\0',&local_129);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_128);
          sVar7 = std::__cxx11::string::size();
          pbVar5 = (byte *)std::__cxx11::string::back();
          snprintf(pcVar6,sVar7,"%.2X",(ulong)*pbVar5);
          uVar8 = __cxa_allocate_exception(0x20);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe40);
          type_error::create(iVar15,(string *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          __cxa_throw(uVar8,&type_error::typeinfo,type_error::~type_error);
        }
        if (iVar15 == 1) {
          peVar10 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x128538);
          pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x12854e);
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar11,local_30);
          if ((local_11 & 1) == 0) {
            peVar10 = std::
                      __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x12859f);
            (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,anon_var_dwarf_23f59,3);
          }
          else {
            peVar10 = std::
                      __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x12857b);
            (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\\ufffd",6);
          }
        }
        else if (iVar15 == 2) {
          peVar10 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1284fa);
          pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x128510);
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar11,local_30);
        }
      }
      return;
    }
    pbVar5 = (byte *)std::__cxx11::string::operator[](local_10);
    iVar15 = (int)(uVar14 >> 0x20);
    local_41 = *pbVar5;
    bVar2 = decode((uint8_t *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,'\0');
    in_stack_fffffffffffffe94 = (uint)bVar2;
    if (bVar2 == 0) {
      in_stack_fffffffffffffe90 = local_18;
      if (local_18 == 8) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = 'b';
      }
      else if (local_18 == 9) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = 't';
      }
      else if (local_18 == 10) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = 'n';
      }
      else if (local_18 == 0xc) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = 'f';
      }
      else if (local_18 == 0xd) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = 'r';
      }
      else if (local_18 == 0x22) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\"';
      }
      else if (local_18 == 0x5c) {
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = '\\';
      }
      else if ((local_18 < 0x20) || (((local_11 & 1) != 0 && (0x7e < local_18)))) {
        if (local_18 < 0x10000) {
          pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x127b90);
          snprintf(pvVar11 + local_28,7,"\\u%04x",(ulong)(local_18 & 0xffff));
          local_28 = local_28 + 6;
        }
        else {
          pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x127bdf);
          snprintf(pvVar11 + local_28,0xd,"\\u%04x\\u%04x",
                   (ulong)((local_18 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_18 & 0x3ff) + 0xdc00 & 0xffff));
          local_28 = local_28 + 0xc;
        }
      }
      else {
        pvVar12 = (value_type_conflict *)std::__cxx11::string::operator[](local_10);
        vVar1 = *pvVar12;
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = vVar1;
      }
      sVar9 = std::array<char,_512UL>::size((array<char,_512UL> *)(in_RDI + 0x5a));
      if (sVar9 - local_28 < 0xd) {
        peVar10 = std::
                  __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x127cb7);
        pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x127cd0);
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar11,local_28);
        local_28 = 0;
      }
      local_30 = local_28;
      local_38 = 0;
    }
    else if (in_stack_fffffffffffffe94 == 1) {
      if (*(int *)(in_RDI + 0x280) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,3,'\0',&local_69);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
        sVar7 = std::__cxx11::string::size();
        snprintf(pcVar6,sVar7,"%.2X",(ulong)local_41);
        local_101 = 1;
        uVar8 = __cxa_allocate_exception(0x20);
        std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
        std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        type_error::create(iVar15,(string *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        local_101 = 0;
        __cxa_throw(uVar8,&type_error::typeinfo,type_error::~type_error);
      }
      if (*(int *)(in_RDI + 0x280) - 1U < 2) {
        if (local_38 != 0) {
          local_40 = local_40 - 1;
        }
        local_28 = local_30;
        if (*(int *)(in_RDI + 0x280) == 1) {
          if ((local_11 & 1) == 0) {
            cVar3 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char>
                    ::to_char_type<char,_char,_nullptr>(-0x11);
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = cVar3;
            cVar3 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char>
                    ::to_char_type<char,_char,_nullptr>(-0x41);
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = cVar3;
            cVar3 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char>
                    ::to_char_type<char,_char,_nullptr>(-0x43);
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = cVar3;
          }
          else {
            local_28 = local_30 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = '\\';
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = 'u';
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = 'f';
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = 'f';
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = 'f';
            local_28 = local_28 + 1;
            pvVar13 = std::array<char,_512UL>::operator[]
                                ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                                 (size_type)in_stack_fffffffffffffdf8);
            *pvVar13 = 'd';
          }
          sVar9 = std::array<char,_512UL>::size((array<char,_512UL> *)(in_RDI + 0x5a));
          if (sVar9 - local_28 < 0xd) {
            peVar10 = std::
                      __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1281d1);
            pvVar11 = std::array<char,_512UL>::data((array<char,_512UL> *)0x1281e7);
            (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar11,local_28);
            local_28 = 0;
          }
        }
        local_38 = 0;
        local_19 = '\0';
        local_30 = local_28;
      }
    }
    else {
      if ((local_11 & 1) == 0) {
        pvVar12 = (value_type_conflict *)std::__cxx11::string::operator[](local_10);
        in_stack_fffffffffffffe4f = *pvVar12;
        local_28 = local_28 + 1;
        pvVar13 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe00,
                             (size_type)in_stack_fffffffffffffdf8);
        *pvVar13 = in_stack_fffffffffffffe4f;
      }
      local_38 = local_38 + 1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        std::uint32_t codepoint;
        std::uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        // number of bytes written at the point of the last valid byte
        std::size_t bytes_after_last_accept = 0;
        std::size_t undumped_chars = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 7, "\\u%04x",
                                                    static_cast<std::uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                    static_cast<std::uint16_t>(0xD7C0u + (codepoint >> 10u)),
                                                    static_cast<std::uint16_t>(0xDC00u + (codepoint & 0x3FFu)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }

                    // remember the byte position of this accept
                    bytes_after_last_accept = bytes;
                    undumped_chars = 0;
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    switch (error_handler)
                    {
                        case error_handler_t::strict:
                        {
                            std::string sn(3, '\0');
                            (std::snprintf)(&sn[0], sn.size(), "%.2X", byte);
                            JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                        }

                        case error_handler_t::ignore:
                        case error_handler_t::replace:
                        {
                            // in case we saw this character the first time, we
                            // would like to read it again, because the byte
                            // may be OK for itself, but just not OK for the
                            // previous sequence
                            if (undumped_chars > 0)
                            {
                                --i;
                            }

                            // reset length buffer to the last accepted index;
                            // thus removing/ignoring the invalid characters
                            bytes = bytes_after_last_accept;

                            if (error_handler == error_handler_t::replace)
                            {
                                // add a replacement character
                                if (ensure_ascii)
                                {
                                    string_buffer[bytes++] = '\\';
                                    string_buffer[bytes++] = 'u';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'd';
                                }
                                else
                                {
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
                                }

                                // write buffer and reset index; there must be 13 bytes
                                // left, as this is the maximal number of bytes to be
                                // written ("\uxxxx\uxxxx\0") for one code point
                                if (string_buffer.size() - bytes < 13)
                                {
                                    o->write_characters(string_buffer.data(), bytes);
                                    bytes = 0;
                                }

                                bytes_after_last_accept = bytes;
                            }

                            undumped_chars = 0;

                            // continue processing the string
                            state = UTF8_ACCEPT;
                            break;
                        }

                        default:            // LCOV_EXCL_LINE
                            assert(false);  // LCOV_EXCL_LINE
                    }
                    break;
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    ++undumped_chars;
                    break;
                }
            }
        }

        // we finished processing the string
        if (JSON_HEDLEY_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            switch (error_handler)
            {
                case error_handler_t::strict:
                {
                    std::string sn(3, '\0');
                    (std::snprintf)(&sn[0], sn.size(), "%.2X", static_cast<std::uint8_t>(s.back()));
                    JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
                }

                case error_handler_t::ignore:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    break;
                }

                case error_handler_t::replace:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    // add a replacement character
                    if (ensure_ascii)
                    {
                        o->write_characters("\\ufffd", 6);
                    }
                    else
                    {
                        o->write_characters("\xEF\xBF\xBD", 3);
                    }
                    break;
                }

                default:            // LCOV_EXCL_LINE
                    assert(false);  // LCOV_EXCL_LINE
            }
        }
    }